

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadMeshSkeletonLink(OgreBinarySerializer *this,Mesh *mesh)

{
  string local_30;
  
  ReadLine_abi_cxx11_(&local_30,this);
  std::__cxx11::string::operator=((string *)&mesh->skeletonRef,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void OgreBinarySerializer::ReadMeshSkeletonLink(Mesh *mesh)
{
    mesh->skeletonRef = ReadLine();
}